

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * image_format_to_type_abi_cxx11_(ImageFormat fmt,BaseType basetype)

{
  CompilerError *pCVar1;
  int in_EDX;
  undefined4 in_register_0000003c;
  string *this;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [17];
  BaseType local_14;
  BaseType basetype_local;
  ImageFormat fmt_local;
  
  this = (string *)CONCAT44(in_register_0000003c,fmt);
  local_14 = basetype;
  _basetype_local = this;
  switch(basetype) {
  case Unknown:
    if (in_EDX == 7) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this,"int4",&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
    }
    else if (in_EDX == 8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this,"uint4",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    else {
      if (in_EDX != 0xd) {
        pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
        spirv_cross::CompilerError::CompilerError(pCVar1,"Unsupported base type for image.");
        __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                    spirv_cross::CompilerError::~CompilerError);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this,"float4",&local_37);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
    }
    break;
  case Void:
  case Boolean:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"float4",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case SByte:
  case Int64:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"float",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case UByte:
  case UInt64:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"unorm float4",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case Short:
  case Image:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"snorm float4",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case UShort:
  case Int:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"float2",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case UInt:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"float3",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case AtomicCounter:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"unorm float4",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case Half:
  case Float:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"unorm float2",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case Double:
  case Struct:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"unorm float",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case SampledImage:
  case Sampler:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"snorm float2",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case AccelerationStructure:
  case RayQuery:
    if (in_EDX != 0xd) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"snorm float",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case ControlPointArray:
  case Interpolant:
  case Char:
    if (in_EDX != 7) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"int4",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case MeshGridProperties:
  case MeshGridProperties|UByte:
  case MeshGridProperties|Short:
    if (in_EDX != 7) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"int",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case BFloat16:
  case MeshGridProperties|Boolean:
  case MeshGridProperties|SByte:
    if (in_EDX != 7) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"int2",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case MeshGridProperties|UShort:
  case MeshGridProperties|Int:
  case 0x20:
    if (in_EDX != 8) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"uint4",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case 0x21:
  case 0x26:
  case 0x27:
    if (in_EDX != 8) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"uint",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x22:
    if (in_EDX != 8) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"uint4",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 0x23:
  case 0x24:
  case 0x25:
    if (in_EDX != 8) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (pCVar1,"Mismatch in image type and base type of image.");
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                  spirv_cross::CompilerError::~CompilerError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"uint2",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  default:
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(pCVar1,"Unrecognized typed image format.");
    __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,
                spirv_cross::CompilerError::~CompilerError);
  }
  return this;
}

Assistant:

static string image_format_to_type(ImageFormat fmt, SPIRType::BaseType basetype)
{
	switch (fmt)
	{
	case ImageFormatR8:
	case ImageFormatR16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float";
	case ImageFormatRg8:
	case ImageFormatRg16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float2";
	case ImageFormatRgba8:
	case ImageFormatRgba16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float4";
	case ImageFormatRgb10A2:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float4";

	case ImageFormatR8Snorm:
	case ImageFormatR16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float";
	case ImageFormatRg8Snorm:
	case ImageFormatRg16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float2";
	case ImageFormatRgba8Snorm:
	case ImageFormatRgba16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float4";

	case ImageFormatR16f:
	case ImageFormatR32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float";
	case ImageFormatRg16f:
	case ImageFormatRg32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float2";
	case ImageFormatRgba16f:
	case ImageFormatRgba32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float4";

	case ImageFormatR11fG11fB10f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float3";

	case ImageFormatR8i:
	case ImageFormatR16i:
	case ImageFormatR32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int";
	case ImageFormatRg8i:
	case ImageFormatRg16i:
	case ImageFormatRg32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int2";
	case ImageFormatRgba8i:
	case ImageFormatRgba16i:
	case ImageFormatRgba32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int4";

	case ImageFormatR8ui:
	case ImageFormatR16ui:
	case ImageFormatR32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint";
	case ImageFormatRg8ui:
	case ImageFormatRg16ui:
	case ImageFormatRg32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint2";
	case ImageFormatRgba8ui:
	case ImageFormatRgba16ui:
	case ImageFormatRgba32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint4";
	case ImageFormatRgb10a2ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint4";

	case ImageFormatUnknown:
		switch (basetype)
		{
		case SPIRType::Float:
			return "float4";
		case SPIRType::Int:
			return "int4";
		case SPIRType::UInt:
			return "uint4";
		default:
			SPIRV_CROSS_THROW("Unsupported base type for image.");
		}

	default:
		SPIRV_CROSS_THROW("Unrecognized typed image format.");
	}
}